

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCallback.cpp
# Opt level: O2

void __thiscall MyEmitter::emitMySignal3(MyEmitter *this)

{
  String local_30;
  
  local_30.data = &local_30._data;
  local_30._data.ref = 0;
  local_30._data.str = "test";
  local_30._data.len = 4;
  Callback::Emitter::emit<MyEmitter,String_const&>(&this->super_Emitter,0x29,(String *)0x0);
  String::~String(&local_30);
  return;
}

Assistant:

void emitMySignal3()
  {
    emit<MyEmitter, const String&>(&MyEmitter::mySignal3, "test");
  }